

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
          (RepeatedMessageFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  byte local_42;
  bool local_2d;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  RepeatedMessageFieldGenerator *this_local;
  
  FieldGenerator::FieldGenerator(&this->super_FieldGenerator,options);
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedMessageFieldGenerator_006f5520;
  this->descriptor_ = descriptor;
  local_2d = false;
  if ((options->proto_h & 1U) != 0) {
    local_2d = IsFieldDependent(descriptor);
  }
  this->dependent_field_ = local_2d;
  local_42 = 0;
  if ((this->dependent_field_ & 1U) != 0) {
    local_42 = options->safe_boundary_check;
  }
  this->dependent_getter_ = (bool)(local_42 & 1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  anon_unknown_3::SetMessageVariables(descriptor,&this->variables_,options);
  return;
}

Assistant:

RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : FieldGenerator(options),
      descriptor_(descriptor),
      dependent_field_(options.proto_h && IsFieldDependent(descriptor)),
      dependent_getter_(dependent_field_ && options.safe_boundary_check) {
  SetMessageVariables(descriptor, &variables_, options);
}